

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O1

int bin_mdef_phone_str(bin_mdef_t *m,int pid,char *buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  mdef_entry_t *pmVar5;
  char **ppcVar6;
  
  if (m == (bin_mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                  ,0x364,"int bin_mdef_phone_str(bin_mdef_t *, int, char *)");
  }
  if ((-1 < pid) && (pid < m->n_phone)) {
    *buf = '\0';
    iVar4 = m->n_ciphone;
    if (pid < iVar4) {
      strcpy(buf,m->ciname[(uint)pid]);
    }
    else {
      pmVar5 = m->phone;
      bVar1 = pmVar5[(uint)pid].info.ci.reserved[0];
      if (((iVar4 <= (int)(uint)bVar1) ||
          (bVar2 = pmVar5[(uint)pid].info.ci.reserved[1], iVar4 <= (int)(uint)bVar2)) ||
         (bVar3 = pmVar5[(uint)pid].info.ci.reserved[2], iVar4 <= (int)(uint)bVar3)) {
        __assert_fail("ci < m->n_ciphone",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                      ,0x2e0,"const char *bin_mdef_ciphone_str(bin_mdef_t *, int32)");
      }
      ppcVar6 = m->ciname;
      sprintf(buf,"%s %s %s %c",ppcVar6[bVar1],ppcVar6[bVar2],ppcVar6[bVar3],
              (ulong)(uint)(int)"ibesu"[pmVar5[(uint)pid].info.ci.filler]);
    }
    return 0;
  }
  __assert_fail("(pid >= 0) && (pid < m->n_phone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0x365,"int bin_mdef_phone_str(bin_mdef_t *, int, char *)");
}

Assistant:

int
bin_mdef_phone_str(bin_mdef_t * m, int pid, char *buf)
{
    char *wpos_name;

    assert(m);
    assert((pid >= 0) && (pid < m->n_phone));
    wpos_name = WPOS_NAME;

    buf[0] = '\0';
    if (pid < m->n_ciphone)
        sprintf(buf, "%s", bin_mdef_ciphone_str(m, pid));
    else {
        sprintf(buf, "%s %s %s %c",
                bin_mdef_ciphone_str(m, m->phone[pid].info.cd.ctx[0]),
                bin_mdef_ciphone_str(m, m->phone[pid].info.cd.ctx[1]),
                bin_mdef_ciphone_str(m, m->phone[pid].info.cd.ctx[2]),
                wpos_name[m->phone[pid].info.cd.wpos]);
    }
    return 0;
}